

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::EraseRecords
          (WalletBatch *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types)

{
  bool bVar1;
  function<bool_(wallet::WalletBatch_&)> *in_R8;
  long in_FS_OFFSET;
  string_view process_desc;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1338:49)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1338:49)>
             ::_M_manager;
  process_desc._M_str = (char *)&local_30;
  process_desc._M_len = (size_t)"erase records";
  local_30._M_unused._M_object = types;
  bVar1 = RunWithinTxn((wallet *)this,(WalletBatch *)0xd,process_desc,in_R8);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseRecords(const std::unordered_set<std::string>& types)
{
    return RunWithinTxn(*this, "erase records", [&types](WalletBatch& self) {
        return std::all_of(types.begin(), types.end(), [&self](const std::string& type) {
            return self.m_batch->ErasePrefix(DataStream() << type);
        });
    });
}